

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O3

planck_unit_suite_t * planck_unit_new_suite(void)

{
  _func_void_planck_unit_suite_t_ptr *p_Var1;
  planck_unit_suite_t *ppVar2;
  
  ppVar2 = (planck_unit_suite_t *)malloc(0x38);
  if (ppVar2 != (planck_unit_suite_t *)0x0) {
    (ppVar2->print_functions).print_postamble = planck_unit_print_funcs_human.print_postamble;
    p_Var1 = planck_unit_print_funcs_human.print_preamble;
    (ppVar2->print_functions).print_result = planck_unit_print_funcs_human.print_result;
    (ppVar2->print_functions).print_preamble = p_Var1;
    ppVar2->total_tests = 0;
    ppVar2->total_passed = 0;
    ppVar2->head = (planck_unit_test_t *)0x0;
    ppVar2->tail = (planck_unit_test_t *)0x0;
  }
  return ppVar2;
}

Assistant:

planck_unit_suite_t *
planck_unit_new_suite(
	void
) {
	planck_unit_suite_t *suite;

	suite = malloc(sizeof(planck_unit_suite_t));

	if (NULL == suite) {
		return suite;
	}

	/* Change default output according to which styles are included. */

#if defined(PLANCK_UNIT_OUTPUT_STYLE_JSON)
	planck_unit_init_suite(suite, planck_unit_print_funcs_json);
#elif defined(PLANCK_UNIT_OUTPUT_STYLE_HUMAN)
	planck_unit_init_suite(suite, planck_unit_print_funcs_human);
#elif defined(PLANCK_UNIT_OUTPUT_STYLE_XML)
	planck_unit_init_suite(suite, planck_unit_print_funcs_xml);
#elif defined(PLANCK_UNIT_OUTPUT_STYLE_CONCISE)
	planck_unit_init_suite(suite, planck_unit_print_funcs_concise);
#endif
	return suite;
}